

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O3

Slice leveldb::test::RandomString(Random *rnd,int len,string *dst)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  Slice SVar6;
  
  std::__cxx11::string::resize((ulong)dst,(char)len);
  if (0 < len) {
    uVar2 = 0;
    do {
      uVar4 = (ulong)rnd->seed_ * 0x41a7;
      uVar3 = (uint)uVar4 & 0x7fffffff;
      iVar1 = (int)(uVar4 >> 0x1f);
      uVar5 = iVar1 + uVar3;
      uVar3 = iVar1 + uVar3 + 0x80000001;
      if (-1 < (int)uVar5) {
        uVar3 = uVar5;
      }
      rnd->seed_ = uVar3;
      (dst->_M_dataplus)._M_p[uVar2] = (char)uVar3 + (char)(uVar3 / 0x5f) * -0x5f + ' ';
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  SVar6.data_ = (dst->_M_dataplus)._M_p;
  SVar6.size_ = dst->_M_string_length;
  return SVar6;
}

Assistant:

Slice RandomString(Random* rnd, int len, std::string* dst) {
  dst->resize(len);
  for (int i = 0; i < len; i++) {
    (*dst)[i] = static_cast<char>(' ' + rnd->Uniform(95));  // ' ' .. '~'
  }
  return Slice(*dst);
}